

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

uint128 absl::lts_20250127::anon_unknown_1::MakeU128Ticks(Duration d)

{
  uint32_t *this;
  uint32_t in_EDX;
  Duration d_00;
  Duration d_01;
  uint128 local_a8;
  uint128 local_98;
  HiRep local_7c;
  uint32_t local_74;
  HiRep local_6c;
  uint32_t local_64;
  uint32_t local_60;
  HiRep HStack_5c;
  uint32_t rep_lo;
  uint local_54;
  HiRep local_4c;
  uint local_44;
  unsigned_long local_40;
  int64_t rep_hi;
  uint local_2c;
  HiRep local_24;
  Duration d_local;
  uint128 u128;
  undefined8 extraout_RDX;
  
  d_00.rep_hi_.lo_ = d.rep_lo_;
  HStack_5c = d.rep_hi_;
  d_00.rep_hi_.hi_ = 0;
  d_00.rep_lo_ = in_EDX;
  local_54 = d_00.rep_hi_.lo_;
  local_4c = HStack_5c;
  local_44 = d_00.rep_hi_.lo_;
  unique0x10000138 = HStack_5c;
  local_2c = d_00.rep_hi_.lo_;
  local_24 = HStack_5c;
  d_local.rep_hi_.lo_ = d_00.rep_hi_.lo_;
  local_40 = time_internal::GetRepHi((time_internal *)HStack_5c,d_00);
  local_6c = local_24;
  local_64 = d_local.rep_hi_.lo_;
  local_7c = local_24;
  local_74 = d_local.rep_hi_.lo_;
  d_01.rep_hi_.hi_ = 0;
  d_01.rep_hi_.lo_ = d_local.rep_hi_.lo_;
  d_01.rep_lo_ = (uint32_t)extraout_RDX;
  local_60 = time_internal::GetRepLo((time_internal *)local_24,d_01);
  if ((long)local_40 < 0) {
    local_40 = -(local_40 + 1);
    local_60 = 4000000000 - local_60;
  }
  this = &d_local.rep_hi_.hi_;
  uint128::uint128((uint128 *)this,local_40);
  uint128::uint128(&local_98,4000000000);
  uint128::operator*=((uint128 *)this,local_98);
  uint128::uint128(&local_a8,local_60);
  uint128::operator+=((uint128 *)this,local_a8);
  return stack0xffffffffffffffe8;
}

Assistant:

inline uint128 MakeU128Ticks(Duration d) {
  int64_t rep_hi = time_internal::GetRepHi(d);
  uint32_t rep_lo = time_internal::GetRepLo(d);
  if (rep_hi < 0) {
    ++rep_hi;
    rep_hi = -rep_hi;
    rep_lo = kTicksPerSecond - rep_lo;
  }
  uint128 u128 = static_cast<uint64_t>(rep_hi);
  u128 *= static_cast<uint64_t>(kTicksPerSecond);
  u128 += rep_lo;
  return u128;
}